

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

bfile_t * bf_create_r(char *filename)

{
  byte *pbVar1;
  FILE *pFVar2;
  bfile_t *pbVar3;
  size_t sVar4;
  char *__dest;
  stat buf;
  stat sStack_a8;
  
  pFVar2 = fopen(filename,"rb");
  if (pFVar2 == (FILE *)0x0) {
    pbVar3 = (bfile_t *)0x0;
  }
  else {
    pbVar3 = create_bfile_t(0x1000);
    pbVar3->file = (FILE *)pFVar2;
    sVar4 = strlen(filename);
    __dest = (char *)malloc(sVar4 + 1);
    pbVar3->filename = __dest;
    strcpy(__dest,filename);
    stat(filename,&sStack_a8);
    pbVar3->size = sStack_a8.st_size;
    pbVar1 = (byte *)((long)&pbVar3->flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  return pbVar3;
}

Assistant:

bfile_t *
bf_create_r(
    const char * filename )
{
    bfile_t * bfile;
    FILE * file;
    struct stat buf;

    bfile = NULL;
    file = fopen( filename, "rb" );
    if ( file ) {
        bfile = create_bfile_t( BFILE_BLOCK_SIZE );
        bfile->file = file;
        bfile->filename = (char *)malloc( strlen( filename ) + 1 );
        assert( bfile->filename );
        strcpy( bfile->filename, filename );
        stat( filename, &buf );
        bfile->size = buf.st_size;
        bfile->flags |= BF_READABLE;
    }

    return bfile;
}